

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

Reg __thiscall
backend::codegen::RegAllocator::alloc_transient_reg
          (RegAllocator *this,Interval i,optional<unsigned_int> orig)

{
  _Rb_tree_header *p_Var1;
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *puVar2;
  size_t *psVar3;
  ConditionCode CVar4;
  undefined4 uVar5;
  int iVar6;
  _List_node_base *p_Var7;
  size_t sVar8;
  __node_base *p_Var9;
  RegAllocator *this_00;
  ulong uVar10;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var11;
  int iVar12;
  pointer __p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  iterator iVar14;
  _Base_ptr p_Var15;
  ostream *poVar16;
  _List_node_base *p_Var17;
  undefined8 *puVar18;
  runtime_error *this_01;
  _Base_ptr p_Var19;
  _Rb_tree_color *p_Var20;
  _Rb_tree_color *p_Var21;
  Interval tag;
  char *pcVar22;
  _Optional_payload_base<unsigned_int> _Var23;
  Tag *pTVar24;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  _Rb_tree_color _Var27;
  bool bVar28;
  size_type __dnew;
  size_type __dnew_1;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  undefined8 local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  RegAllocator *local_240;
  undefined8 local_238;
  ulong local_230;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_228;
  undefined1 *local_220;
  undefined8 local_218;
  undefined1 local_210;
  undefined7 uStack_20f;
  undefined1 local_200;
  ostream local_1f1;
  _Optional_payload_base<unsigned_int> local_1f0;
  int local_1e4;
  Interval local_1e0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1d8;
  undefined **local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  ulong local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  size_t local_170;
  bool local_168;
  
  local_1f0 = (_Optional_payload_base<unsigned_int>)
              orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>;
  if (((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
    local_238 = (_List_node_base *)((ulong)local_238 & 0xffffffffffffff00);
    tag = i;
    AixLog::operator<<((ostream *)&local_238,(Severity *)i);
    local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_218 = 0;
    local_210 = 0;
    local_200 = 1;
    local_220 = &local_210;
    AixLog::operator<<((ostream *)&local_228,(Tag *)tag);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001eaf58;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)tag);
    local_260 = &local_250;
    local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x13;
    local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_280);
    local_250._M_allocated_capacity = (size_type)local_280;
    local_260->_M_allocated_capacity = 0x72745f636f6c6c61;
    *(char *)((long)local_260 + 8) = 'a';
    *(char *)((long)local_260 + 9) = 'n';
    *(char *)((long)local_260 + 10) = 's';
    *(char *)((long)local_260 + 0xb) = 'i';
    *(char *)((long)local_260 + 0xc) = 'e';
    *(char *)((long)local_260 + 0xd) = 'n';
    *(char *)((long)local_260 + 0xe) = 't';
    *(char *)((long)local_260 + 0xf) = '_';
    *(char *)((long)local_260 + 0xf) = '_';
    *(char *)((long)local_260 + 0x10) = 'r';
    *(char *)((long)local_260 + 0x11) = 'e';
    *(char *)((long)local_260 + 0x12) = 'g';
    local_258 = local_280;
    local_260->_M_local_buf[(long)local_280] = '\0';
    local_230 = 0x60;
    local_280 = &local_270;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_230);
    uVar10 = local_230;
    local_270._M_allocated_capacity = local_230;
    pcVar22 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_280 = paVar13;
    memcpy(paVar13,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar13->_M_local_buf[uVar10] = '\0';
    local_1b8._0_4_ = 0x1eafb8;
    local_1b8._4_4_ = 0;
    local_1b8._8_8_ = local_260;
    if (local_260 == &local_250) {
      local_1a0._8_8_ = local_250._8_8_;
      local_1b8._8_8_ = &local_1a0;
    }
    local_1a0._M_allocated_capacity = local_250._M_allocated_capacity;
    local_190._M_p = (pointer)&local_180;
    local_1a8 = local_258;
    local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
    if (local_280 == &local_270) {
      local_180._8_8_ = local_270._8_8_;
    }
    else {
      local_190._M_p = (pointer)local_280;
    }
    local_180._M_allocated_capacity = local_270._M_allocated_capacity;
    local_188 = uVar10;
    local_278 = 0;
    local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
    local_170 = 0x1f6;
    local_168 = false;
    local_280 = &local_270;
    local_260 = &local_250;
    AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar22);
    pcVar22 = "orig ";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"orig ",5);
    AixLog::Function::~Function((Function *)local_1b8);
    if (local_280 != &local_270) {
      pcVar22 = (char *)(local_270._M_allocated_capacity + 1);
      operator_delete(local_280,(ulong)pcVar22);
    }
    if (local_260 != &local_250) {
      pcVar22 = (char *)(local_250._M_allocated_capacity + 1);
      operator_delete(local_260,(ulong)pcVar22);
    }
    local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    if (local_220 != &local_210) {
      pcVar22 = (char *)(CONCAT71(uStack_20f,local_210) + 1);
      operator_delete(local_220,(ulong)pcVar22);
    }
    local_238 = (_List_node_base *)((ulong)local_238 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_238,(Severity *)pcVar22);
    local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_218 = 0;
    local_210 = 0;
    local_200 = 1;
    local_220 = &local_210;
    AixLog::operator<<((ostream *)&local_228,(Tag *)pcVar22);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001eaf58;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pcVar22);
    local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x13;
    local_260 = &local_250;
    local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_280);
    local_250._M_allocated_capacity = (size_type)local_280;
    local_260->_M_allocated_capacity = 0x72745f636f6c6c61;
    *(char *)((long)local_260 + 8) = 'a';
    *(char *)((long)local_260 + 9) = 'n';
    *(char *)((long)local_260 + 10) = 's';
    *(char *)((long)local_260 + 0xb) = 'i';
    *(char *)((long)local_260 + 0xc) = 'e';
    *(char *)((long)local_260 + 0xd) = 'n';
    *(char *)((long)local_260 + 0xe) = 't';
    *(char *)((long)local_260 + 0xf) = '_';
    *(char *)((long)local_260 + 0xf) = '_';
    *(char *)((long)local_260 + 0x10) = 'r';
    *(char *)((long)local_260 + 0x11) = 'e';
    *(char *)((long)local_260 + 0x12) = 'g';
    local_258 = local_280;
    local_260->_M_local_buf[(long)local_280] = '\0';
    local_230 = 0x60;
    local_280 = &local_270;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_230);
    uVar10 = local_230;
    local_270._M_allocated_capacity = local_230;
    pcVar22 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_280 = paVar13;
    memcpy(paVar13,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar13->_M_local_buf[uVar10] = '\0';
    local_1b8._0_4_ = 0x1eafb8;
    local_1b8._4_4_ = 0;
    local_1b8._8_8_ = local_260;
    if (local_260 == &local_250) {
      local_1a0._8_8_ = local_250._8_8_;
      local_1b8._8_8_ = &local_1a0;
    }
    local_1a0._M_allocated_capacity = local_250._M_allocated_capacity;
    local_190._M_p = (pointer)&local_180;
    local_1a8 = local_258;
    local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
    if (local_280 == &local_270) {
      local_180._8_8_ = local_270._8_8_;
    }
    else {
      local_190._M_p = (pointer)local_280;
    }
    local_180._M_allocated_capacity = local_270._M_allocated_capacity;
    local_188 = uVar10;
    local_278 = 0;
    local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
    local_170 = 0x1f7;
    local_168 = false;
    local_280 = &local_270;
    local_260 = &local_250;
    AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar22);
    _Var23 = local_1f0;
    arm::display_reg_name((ostream *)&std::clog,local_1f0._M_payload._M_value);
    AixLog::Function::~Function((Function *)local_1b8);
    if (local_280 != &local_270) {
      _Var23 = (_Optional_payload_base<unsigned_int>)(local_270._M_allocated_capacity + 1);
      operator_delete(local_280,(ulong)_Var23);
    }
    if (local_260 != &local_250) {
      _Var23 = (_Optional_payload_base<unsigned_int>)(local_250._M_allocated_capacity + 1);
      operator_delete(local_260,(ulong)_Var23);
    }
    local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    if (local_220 != &local_210) {
      _Var23 = (_Optional_payload_base<unsigned_int>)(CONCAT71(uStack_20f,local_210) + 1);
      operator_delete(local_220,(ulong)_Var23);
    }
    local_238 = (_List_node_base *)((ulong)local_238 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_238,(Severity *)_Var23);
    local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    local_218 = 0;
    local_210 = 0;
    local_200 = 1;
    local_220 = &local_210;
    AixLog::operator<<((ostream *)&local_228,(Tag *)_Var23);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001eaf58;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)_Var23);
    local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x13;
    local_260 = &local_250;
    local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_280);
    local_250._M_allocated_capacity = (size_type)local_280;
    local_260->_M_allocated_capacity = 0x72745f636f6c6c61;
    *(char *)((long)local_260 + 8) = 'a';
    *(char *)((long)local_260 + 9) = 'n';
    *(char *)((long)local_260 + 10) = 's';
    *(char *)((long)local_260 + 0xb) = 'i';
    *(char *)((long)local_260 + 0xc) = 'e';
    *(char *)((long)local_260 + 0xd) = 'n';
    *(char *)((long)local_260 + 0xe) = 't';
    *(char *)((long)local_260 + 0xf) = '_';
    *(char *)((long)local_260 + 0xf) = '_';
    *(char *)((long)local_260 + 0x10) = 'r';
    *(char *)((long)local_260 + 0x11) = 'e';
    *(char *)((long)local_260 + 0x12) = 'g';
    local_258 = local_280;
    local_260->_M_local_buf[(long)local_280] = '\0';
    local_230 = 0x60;
    local_280 = &local_270;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_230);
    uVar10 = local_230;
    local_270._M_allocated_capacity = local_230;
    pcVar22 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
    ;
    local_280 = paVar13;
    memcpy(paVar13,
           "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
           ,0x60);
    paVar13->_M_local_buf[uVar10] = '\0';
    local_1b8._0_4_ = 0x1eafb8;
    local_1b8._4_4_ = 0;
    local_1b8._8_8_ = local_260;
    if (local_260 == &local_250) {
      local_1a0._8_8_ = local_250._8_8_;
      local_1b8._8_8_ = &local_1a0;
    }
    local_1a0._M_allocated_capacity = local_250._M_allocated_capacity;
    local_190._M_p = (pointer)&local_180;
    local_1a8 = local_258;
    local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
    if (local_280 == &local_270) {
      local_180._8_8_ = local_270._8_8_;
    }
    else {
      local_190._M_p = (pointer)local_280;
    }
    local_180._M_allocated_capacity = local_270._M_allocated_capacity;
    local_188 = uVar10;
    local_278 = 0;
    local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
    local_170 = 0x1f8;
    local_168 = false;
    local_280 = &local_270;
    local_260 = &local_250;
    AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar22);
    pTVar24 = (Tag *)0x1b9532;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," ",1);
    AixLog::Function::~Function((Function *)local_1b8);
    if (local_280 != &local_270) {
      pTVar24 = (Tag *)(local_270._M_allocated_capacity + 1);
      operator_delete(local_280,(ulong)pTVar24);
    }
    if (local_260 != &local_250) {
      pTVar24 = (Tag *)(local_250._M_allocated_capacity + 1);
      operator_delete(local_260,(ulong)pTVar24);
    }
    local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
    if (local_220 != &local_210) {
      pTVar24 = (Tag *)(CONCAT71(uStack_20f,local_210) + 1);
      operator_delete(local_220,(ulong)pTVar24);
    }
    p_Var17 = (_List_node_base *)&this->active_reg_map;
    while (p_Var17 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var17 != (_List_node_base *)&this->active_reg_map) {
      if (*(uint *)&p_Var17[1]._M_next == local_1f0._M_payload._M_value) {
        local_238 = (_List_node_base *)((ulong)local_238 & 0xffffffffffffff00);
        AixLog::operator<<((ostream *)&local_238,(Severity *)pTVar24);
        local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
        local_220 = &local_210;
        local_218 = 0;
        local_210 = 0;
        local_200 = 1;
        AixLog::operator<<((ostream *)&local_228,pTVar24);
        local_1c8 = std::chrono::_V2::system_clock::now();
        local_1d0 = &PTR__Timestamp_001eaf58;
        local_1c0 = 0;
        AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pTVar24);
        local_260 = &local_250;
        local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x13;
        local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_280);
        local_250._M_allocated_capacity = (size_type)local_280;
        local_260->_M_allocated_capacity = 0x72745f636f6c6c61;
        *(char *)((long)local_260 + 8) = 'a';
        *(char *)((long)local_260 + 9) = 'n';
        *(char *)((long)local_260 + 10) = 's';
        *(char *)((long)local_260 + 0xb) = 'i';
        *(char *)((long)local_260 + 0xc) = 'e';
        *(char *)((long)local_260 + 0xd) = 'n';
        *(char *)((long)local_260 + 0xe) = 't';
        *(char *)((long)local_260 + 0xf) = '_';
        *(char *)((long)local_260 + 0xf) = '_';
        *(char *)((long)local_260 + 0x10) = 'r';
        *(char *)((long)local_260 + 0x11) = 'e';
        *(char *)((long)local_260 + 0x12) = 'g';
        local_258 = local_280;
        local_260->_M_local_buf[(long)local_280] = '\0';
        local_230 = 0x60;
        local_280 = &local_270;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_230);
        uVar10 = local_230;
        local_270._M_allocated_capacity = local_230;
        pcVar22 = 
        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
        ;
        local_280 = paVar13;
        memcpy(paVar13,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,0x60);
        paVar13->_M_local_buf[uVar10] = '\0';
        local_1b8._0_4_ = 0x1eafb8;
        local_1b8._4_4_ = 0;
        local_1b8._8_8_ = local_260;
        if (local_260 == &local_250) {
          local_1a0._8_8_ = local_250._8_8_;
          local_1b8._8_8_ = &local_1a0;
        }
        local_1a0._M_allocated_capacity = local_250._M_allocated_capacity;
        local_190._M_p = (pointer)&local_180;
        local_1a8 = local_258;
        local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
        if (local_280 == &local_270) {
          local_180._8_8_ = local_270._8_8_;
        }
        else {
          local_190._M_p = (pointer)local_280;
        }
        local_180._M_allocated_capacity = local_270._M_allocated_capacity;
        local_188 = uVar10;
        local_278 = 0;
        local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
        local_170 = 0x201;
        local_168 = false;
        local_280 = &local_270;
        local_260 = &local_250;
        AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar22);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"r-> ",4);
        poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        AixLog::Function::~Function((Function *)local_1b8);
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270._M_allocated_capacity + 1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250._M_allocated_capacity + 1);
        }
        local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
        if (local_220 != &local_210) {
          operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
        }
        _Var27 = *(_Rb_tree_color *)((long)&p_Var17[1]._M_next + 4);
        p_Var7 = p_Var17[1]._M_next;
        psVar3 = &(this->active_reg_map).
                  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl._M_node._M_size;
        *psVar3 = *psVar3 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var17,0x18);
        p_Var17 = (_List_node_base *)operator_new(0x18);
        p_Var17[1]._M_next = p_Var7;
        std::__detail::_List_node_base::_M_hook(p_Var17);
        psVar3 = &(this->active_reg_map).
                  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl._M_node._M_size;
        *psVar3 = *psVar3 + 1;
        return _Var27;
      }
    }
  }
  p_Var21 = DAT_001ef410;
  p_Var20 = DAT_001ef3f8;
  p_Var15 = (this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_240 = this;
  local_1e0 = i;
  if (p_Var15 != (_Base_ptr)0x0) {
    p_Var19 = &(this->bl_points)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var25 = p_Var19;
    p_Var26 = p_Var15;
    do {
      if ((int)i.start <= (int)p_Var26[1]._M_color) {
        p_Var25 = p_Var26;
      }
      p_Var26 = (&p_Var26->_M_left)[(int)p_Var26[1]._M_color < (int)i.start];
    } while (p_Var26 != (_Base_ptr)0x0);
    do {
      if ((int)i.end < (int)p_Var15[1]._M_color) {
        p_Var19 = p_Var15;
      }
      p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color <= (int)i.end];
    } while (p_Var15 != (_Base_ptr)0x0);
    if (p_Var25 != p_Var19) {
      if (arm::GLOB_REGS != DAT_001ef410) {
        p_Var1 = &(this->used_regs)._M_t._M_impl.super__Rb_tree_header;
        p_Var20 = arm::GLOB_REGS;
        do {
          local_1b8._0_4_ = *p_Var20;
          iVar14 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->active)._M_h,(key_type_conflict *)local_1b8);
          _Var27 = local_1b8._0_4_;
          if (iVar14.
              super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
              ._M_cur == (__node_type *)0x0) {
            p_Var15 = (local_240->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var19 = &p_Var1->_M_header;
            if (p_Var15 != (_Base_ptr)0x0) {
              do {
                bVar28 = p_Var15[1]._M_color < (uint)local_1b8._0_4_;
                if (!bVar28) {
                  p_Var19 = p_Var15;
                }
                p_Var15 = (&p_Var15->_M_left)[bVar28];
              } while (p_Var15 != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var19 != p_Var1) {
                if (p_Var19[1]._M_color <= (uint)local_1b8._0_4_) goto LAB_00175fa9;
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)&local_240->used_regs_temp,(uint *)local_1b8);
                goto LAB_0017672b;
              }
            }
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_240->used_regs_temp,(uint *)local_1b8);
            if (_Var27 != ~_S_red) goto LAB_0017672b;
            break;
          }
LAB_00175fa9:
          p_Var20 = p_Var20 + 1;
        } while (p_Var20 != p_Var21);
      }
      p_Var20 = DAT_001ef3f8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._8_8_;
      if (arm::TEMP_REGS != DAT_001ef3f8) {
        puVar2 = &local_240->active;
        p_Var21 = arm::TEMP_REGS;
        do {
          local_1b8._0_4_ = *p_Var21;
          iVar14 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&puVar2->_M_h,(key_type_conflict *)local_1b8);
          _Var27 = local_1b8._0_4_;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._8_8_;
          if (iVar14.
              super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
              ._M_cur == (__node_type *)0x0) goto LAB_001762c5;
          p_Var21 = p_Var21 + 1;
        } while (p_Var21 != p_Var20);
      }
      goto LAB_001762cf;
    }
  }
  if (arm::TEMP_REGS != DAT_001ef3f8) {
    p_Var21 = arm::TEMP_REGS;
    do {
      local_1b8._0_4_ = *p_Var21;
      iVar14 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->active)._M_h,(key_type_conflict *)local_1b8);
      if (iVar14.
          super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
          ._M_cur == (__node_type *)0x0) {
        _Var27 = local_1b8._0_4_;
        if (local_1b8._0_4_ != ~_S_red) goto LAB_0017672b;
        break;
      }
      p_Var21 = p_Var21 + 1;
    } while (p_Var21 != p_Var20);
  }
  p_Var20 = DAT_001ef410;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._8_8_;
  if (arm::GLOB_REGS != DAT_001ef410) {
    puVar2 = &local_240->active;
    p_Var1 = &(local_240->used_regs)._M_t._M_impl.super__Rb_tree_header;
    p_Var21 = arm::GLOB_REGS;
LAB_00176043:
    local_1b8._0_4_ = *p_Var21;
    iVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&puVar2->_M_h,(key_type_conflict *)local_1b8);
    _Var27 = local_1b8._0_4_;
    if (iVar14.
        super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>.
        _M_cur != (__node_type *)0x0) goto LAB_00176097;
    p_Var15 = (local_240->used_regs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var19 = &p_Var1->_M_header;
    if (p_Var15 != (_Base_ptr)0x0) {
      do {
        bVar28 = (_Rb_tree_color)*(size_t *)(p_Var15 + 1) < (uint)local_1b8._0_4_;
        if (!bVar28) {
          p_Var19 = p_Var15;
        }
        p_Var15 = (&p_Var15->_M_left)[bVar28];
      } while (p_Var15 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var19 != p_Var1) &&
         ((_Rb_tree_color)((_Rb_tree_header *)p_Var19)->_M_node_count <= (uint)local_1b8._0_4_))
      goto LAB_00176097;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_240->used_regs_temp,(uint *)local_1b8);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._8_8_;
LAB_001762c5:
    local_1b8._12_4_ = (undefined4)((ulong)paVar13 >> 0x20);
    if (_Var27 != ~_S_red) goto LAB_0017672b;
  }
LAB_001762cf:
  this_00 = local_240;
  sVar8 = (local_240->active_reg_map).
          super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl._M_node._M_size;
  local_1b8._8_8_ = paVar13;
  if (sVar8 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Failed to allocate: all active registers are temporary!",0x37)
    ;
    poVar16 = std::endl<char,std::char_traits<char>>((ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Dump: ",6);
    std::endl<char,std::char_traits<char>>(poVar16);
    local_240 = (RegAllocator *)&(local_240->active)._M_h._M_before_begin;
    while (p_Var9 = (__node_base *)local_240->f, p_Var9 != (__node_base *)0x0) {
      local_240 = (RegAllocator *)p_Var9;
      arm::display_reg_name((ostream *)&local_1a8,(Reg)*(size_type *)(p_Var9 + 1));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": [",3);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"]",1);
      std::endl<char,std::char_traits<char>>(poVar16);
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_01,(string *)&local_228);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var17 = (local_240->active_reg_map).
            super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_238 = p_Var17[1]._M_next;
  (local_240->active_reg_map).
  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl._M_node._M_size = sVar8 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var17,0x18);
  iVar14 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this_00->active)._M_h,(key_type_conflict *)((long)&local_238 + 4));
  if (iVar14.
      super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>.
      _M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  uVar5 = *(undefined4 *)
           ((long)iVar14.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
                  ._M_cur + 0x10);
  iVar12 = get_or_alloc_spill_pos(this_00,(Reg)local_238);
  iVar6 = this_00->stack_offset;
  puVar18 = (undefined8 *)operator_new(0x50);
  CVar4 = this_00->cur_cond;
  *(undefined4 *)(puVar18 + 1) = 0x1c;
  *(ConditionCode *)((long)puVar18 + 0xc) = CVar4;
  *puVar18 = &PTR_display_001ed9b0;
  *(_Rb_tree_color *)(puVar18 + 2) = local_238._4_4_;
  puVar18[3] = &PTR_display_001ed7f0;
  puVar18[4] = 0xd00000000;
  *(undefined1 *)(puVar18 + 7) = 1;
  *(short *)(puVar18 + 5) = (short)iVar6 + (short)iVar12;
  *(undefined1 *)(puVar18 + 9) = 1;
  local_228._M_head_impl = (LoadStoreInst *)0x0;
  pTVar24 = (Tag *)local_1b8;
  local_1b8._0_4_ = SUB84(puVar18,0);
  local_1b8._4_4_ = (undefined4)((ulong)puVar18 >> 0x20);
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)&this_00->inst_sink,
             (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pTVar24);
  if ((long *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 0x10))();
  }
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
            ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)&local_228)
  ;
  local_1f1 = (ostream)0x0;
  AixLog::operator<<(&local_1f1,(Severity *)pTVar24);
  local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  local_220 = &local_210;
  local_218 = 0;
  local_210 = 0;
  local_200 = 1;
  AixLog::operator<<((ostream *)&local_228,pTVar24);
  local_1c8 = std::chrono::_V2::system_clock::now();
  local_1d0 = &PTR__Timestamp_001eaf58;
  local_1c0 = 0;
  AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pTVar24);
  local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x13;
  local_260 = &local_250;
  local_1e4 = iVar12;
  local_1d8 = &(this_00->active)._M_h;
  local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_280);
  local_250._M_allocated_capacity = (size_type)local_280;
  local_260->_M_allocated_capacity = 0x72745f636f6c6c61;
  *(char *)((long)local_260 + 8) = 'a';
  *(char *)((long)local_260 + 9) = 'n';
  *(char *)((long)local_260 + 10) = 's';
  *(char *)((long)local_260 + 0xb) = 'i';
  *(char *)((long)local_260 + 0xc) = 'e';
  *(char *)((long)local_260 + 0xd) = 'n';
  *(char *)((long)local_260 + 0xe) = 't';
  *(char *)((long)local_260 + 0xf) = '_';
  *(char *)((long)local_260 + 0xf) = '_';
  *(char *)((long)local_260 + 0x10) = 'r';
  *(char *)((long)local_260 + 0x11) = 'e';
  *(char *)((long)local_260 + 0x12) = 'g';
  local_258 = local_280;
  local_260->_M_local_buf[(long)local_280] = '\0';
  local_230 = 0x60;
  local_280 = &local_270;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_230);
  uVar10 = local_230;
  local_270._M_allocated_capacity = local_230;
  pcVar22 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_280 = paVar13;
  memcpy(paVar13,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
         ,0x60);
  paVar13->_M_local_buf[uVar10] = '\0';
  local_1b8._0_4_ = 0x1eafb8;
  local_1b8._4_4_ = 0;
  local_1b8._8_8_ = local_260;
  if (local_260 == &local_250) {
    local_1a0._8_8_ = local_250._8_8_;
    local_1b8._8_8_ = &local_1a0;
  }
  local_1a0._M_allocated_capacity = local_250._M_allocated_capacity;
  local_190._M_p = (pointer)&local_180;
  local_1a8 = local_258;
  local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
  if (local_280 == &local_270) {
    local_180._8_8_ = local_270._8_8_;
  }
  else {
    local_190._M_p = (pointer)local_280;
  }
  local_180._M_allocated_capacity = local_270._M_allocated_capacity;
  local_188 = uVar10;
  local_278 = 0;
  local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
  local_170 = 0x247;
  local_168 = false;
  local_280 = &local_270;
  local_260 = &local_250;
  AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar22);
  AixLog::Function::~Function((Function *)local_1b8);
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270._M_allocated_capacity + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250._M_allocated_capacity + 1);
  }
  local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Spilling: ",10);
  arm::display_reg_name((ostream *)&std::clog,local_238._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," -> ",4);
  arm::display_reg_name((ostream *)&std::clog,(Reg)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," -> ",4);
  poVar16 = (ostream *)std::ostream::operator<<(&std::clog,local_1e4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  _Var27 = local_238._4_4_;
  local_1b8._0_4_ = (Reg)local_238;
  local_1b8._4_4_ = local_1e0.start;
  local_1b8._8_4_ = uVar5;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this_00->spilled_regs);
  p_Var11 = local_1d8;
  p_Var17 = (_List_node_base *)&this_00->active_reg_map;
  do {
    p_Var17 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var17 == (_List_node_base *)&this_00->active_reg_map) goto LAB_0017671e;
  } while ((((ulong)local_1f0 >> 0x20 & 1) == 0) ||
          (*(uint *)&p_Var17[1]._M_next != local_1f0._M_payload._M_value));
  psVar3 = &(this_00->active_reg_map).
            super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl._M_node._M_size;
  *psVar3 = *psVar3 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var17,0x18);
LAB_0017671e:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(p_Var11,(long)&local_238 + 4);
LAB_0017672b:
  pTVar24 = (Tag *)local_1b8;
  local_1b8._4_4_ = local_1e0.start;
  local_1b8._8_4_ = local_1e0.end;
  local_1b8._0_4_ = _Var27;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_240->active);
  _Var23 = local_1f0;
  if (((ulong)local_1f0 >> 0x20 & 1) != 0) {
    pTVar24 = (Tag *)&local_240->active_reg_map;
    p_Var17 = (_List_node_base *)operator_new(0x18);
    p_Var17[1]._M_next = (_List_node_base *)((ulong)_Var23 & 0xffffffff | (ulong)_Var27 << 0x20);
    std::__detail::_List_node_base::_M_hook(p_Var17);
    psVar3 = &(local_240->active_reg_map).
              super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl._M_node._M_size;
    *psVar3 = *psVar3 + 1;
  }
  local_238 = (_List_node_base *)((ulong)local_238 & 0xffffffffffffff00);
  AixLog::operator<<((ostream *)&local_238,(Severity *)pTVar24);
  local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  local_218 = 0;
  local_210 = 0;
  local_200 = 1;
  local_220 = &local_210;
  AixLog::operator<<((ostream *)&local_228,pTVar24);
  local_1c8 = std::chrono::_V2::system_clock::now();
  local_1d0 = &PTR__Timestamp_001eaf58;
  local_1c0 = 0;
  AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pTVar24);
  local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x13;
  local_260 = &local_250;
  local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_260,(ulong)&local_280);
  local_250._M_allocated_capacity = (size_type)local_280;
  local_260->_M_allocated_capacity = 0x72745f636f6c6c61;
  *(char *)((long)local_260 + 8) = 'a';
  *(char *)((long)local_260 + 9) = 'n';
  *(char *)((long)local_260 + 10) = 's';
  *(char *)((long)local_260 + 0xb) = 'i';
  *(char *)((long)local_260 + 0xc) = 'e';
  *(char *)((long)local_260 + 0xd) = 'n';
  *(char *)((long)local_260 + 0xe) = 't';
  *(char *)((long)local_260 + 0xf) = '_';
  *(char *)((long)local_260 + 0xf) = '_';
  *(char *)((long)local_260 + 0x10) = 'r';
  *(char *)((long)local_260 + 0x11) = 'e';
  *(char *)((long)local_260 + 0x12) = 'g';
  local_258 = local_280;
  local_260->_M_local_buf[(long)local_280] = '\0';
  local_230 = 0x60;
  local_280 = &local_270;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_230);
  uVar10 = local_230;
  local_270._M_allocated_capacity = local_230;
  pcVar22 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_280 = paVar13;
  memcpy(paVar13,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
         ,0x60);
  paVar13->_M_local_buf[uVar10] = '\0';
  local_1b8._0_4_ = 0x1eafb8;
  local_1b8._4_4_ = 0;
  local_1b8._8_8_ = local_260;
  if (local_260 == &local_250) {
    local_1a0._8_8_ = local_250._8_8_;
    local_1b8._8_8_ = &local_1a0;
  }
  local_1a0._M_allocated_capacity = local_250._M_allocated_capacity;
  local_190._M_p = (pointer)&local_180;
  local_1a8 = local_258;
  local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
  if (local_280 == &local_270) {
    local_180._8_8_ = local_270._8_8_;
  }
  else {
    local_190._M_p = (pointer)local_280;
  }
  local_180._M_allocated_capacity = local_270._M_allocated_capacity;
  local_188 = uVar10;
  local_278 = 0;
  local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
  local_170 = 0x260;
  local_168 = false;
  local_280 = &local_270;
  local_260 = &local_250;
  AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"-> ",3);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_1b8);
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270._M_allocated_capacity + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250._M_allocated_capacity + 1);
  }
  local_228._M_head_impl = (LoadStoreInst *)&PTR__Tag_001eaf88;
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
  }
  display_active_regs(local_240);
  return _Var27;
LAB_00176097:
  p_Var21 = p_Var21 + 1;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._8_8_;
  if (p_Var21 == p_Var20) goto LAB_001762cf;
  goto LAB_00176043;
}

Assistant:

Reg RegAllocator::alloc_transient_reg(Interval i, std::optional<Reg> orig) {
  Reg r = -1;
  if (orig) {
    LOG(TRACE) << "orig ";
    display_reg_name(LOG(TRACE), orig.value());
    LOG(TRACE) << " ";
    auto it = active_reg_map.begin();
    while (it != active_reg_map.end()) {
      if (it->first == orig)
        break;
      else
        it++;
    }
    if (it != active_reg_map.end()) {
      LOG(TRACE) << "r-> " << it->second << std::endl;
      auto r = it->second;
      auto x = *it;
      active_reg_map.erase(it);
      active_reg_map.push_back(x);
      return r;
    }
  }
  auto alloc_using_temp = [&]() {
    if (r == -1) {
      for (auto reg : TEMP_REGS) {
        if (active.find(reg) == active.end()) {
          r = reg;
          break;
        }
      }
    }
  };
  auto alloc_using_glob = [&]() {
    if (r == -1) {
      for (auto reg : GLOB_REGS) {
        if (active.find(reg) == active.end() &&
            used_regs.find(reg) == used_regs.end()) {
          r = reg;
          used_regs_temp.insert(reg);
          break;
        }
      }
    }
  };
  {
    auto lower_bound = bl_points.lower_bound(i.start);
    auto upper_bound = bl_points.upper_bound(i.end);
    if (lower_bound != upper_bound) {
      // Cross-BL virtual register
      alloc_using_glob();
      alloc_using_temp();
    } else {
      // non-cross-bl virtual register
      alloc_using_temp();
      alloc_using_glob();
    }
  }
  if (r == -1) {
    // Choose a value in active to spill.
    // NOTE: the current algorithm chooses the earliest-allocated register
    if (active_reg_map.size() == 0) {
      std::stringstream ss;
      ss << "Failed to allocate: all active registers are "
            "temporary!"
         << std::endl
         << "Dump: " << std::endl;

      for (auto [k, v] : active) {
        display_reg_name(ss, k);
        ss << ": [" << v.start << ", " << v.end << "]" << std::endl;
      }

      throw std::runtime_error(ss.str());
    }
    auto [spill_virt, spill_phys] = active_reg_map.front();
    active_reg_map.pop_front();
    auto interval = active.at(spill_phys);
    interval.start = i.start;
    int spill_pos = get_or_alloc_spill_pos(spill_virt);
    // TODO: move this into a separate function
    inst_sink.push_back(std::make_unique<LoadStoreInst>(
        OpCode::StR, spill_phys,
        MemoryOperand(REG_SP, spill_pos + stack_offset), cur_cond));

    auto &trace = LOG(TRACE);
    trace << "Spilling: ";
    display_reg_name(trace, spill_phys);
    trace << " -> ";
    display_reg_name(trace, spill_virt);
    trace << " -> " << spill_pos << " ";

    r = spill_phys;
    spilled_regs.insert({spill_virt, interval});
    {
      auto it = active_reg_map.begin();
      while (it != active_reg_map.end()) {
        if (it->first == orig) {
          active_reg_map.erase(it);
          break;
        } else
          it++;
      }
    }
    active.erase(spill_phys);
  }
  this->active.insert({r, i});
  if (orig) {
    this->active_reg_map.push_back({orig.value(), r});
  }
  LOG(TRACE) << "-> " << r << std::endl;
  display_active_regs();
  return r;
}